

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O3

Time * __thiscall Storage::Time::operator+=(Time *this,Time *other)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong __n;
  ulong uVar4;
  uint uVar5;
  _Ct __n2;
  ulong uVar6;
  _Ct __m2;
  
  uVar4 = (ulong)other->length;
  if (uVar4 == 0) {
    return this;
  }
  uVar2 = (ulong)this->length;
  if (uVar2 == 0) {
    *this = *other;
    return this;
  }
  __n = (ulong)this->clock_rate;
  uVar1 = other->clock_rate;
  if (this->clock_rate == uVar1) {
    uVar2 = uVar2 + uVar4;
  }
  else {
    uVar2 = uVar2 * uVar1 + uVar4 * __n;
    __n = __n * uVar1;
  }
  if ((__n | uVar2) >> 0x20 == 0) {
    this->length = (uint)uVar2;
    goto LAB_0043be75;
  }
  if (uVar2 != 0) {
    uVar4 = uVar2;
    uVar6 = __n;
    if (((__n | uVar2) & 0xf) == 0) {
      do {
        uVar2 = uVar4 >> 4;
        __n = uVar6 >> 4;
        uVar1 = (uint)uVar4;
        uVar5 = (uint)uVar6;
        uVar4 = uVar2;
        uVar6 = __n;
      } while (((uVar1 | uVar5) & 0xf0) == 0);
    }
    uVar1 = ((uint)uVar2 | (uint)__n) & 1;
    while (uVar1 == 0) {
      uVar1 = ((uint)uVar2 | (uint)__n) & 2;
      uVar2 = uVar2 >> 1;
      __n = __n >> 1;
    }
    if ((uVar2 >> 0x20 != 0) || (__n >> 0x20 != 0)) {
      uVar3 = std::__detail::__gcd<unsigned_long>(uVar2,__n);
      uVar2 = uVar2 / uVar3;
      __n = __n / uVar3;
      do {
        if (uVar2 >> 0x20 == 0) {
          if (__n >> 0x20 == 0) break;
        }
        else if (__n < 2) goto LAB_0043be69;
        uVar2 = uVar2 >> 1;
        __n = __n >> 1;
      } while( true );
    }
    this->length = (uint)uVar2;
    goto LAB_0043be75;
  }
  this->length = 0;
LAB_0043be6f:
  __n = 1;
LAB_0043be75:
  this->clock_rate = (uint)__n;
  return this;
LAB_0043be69:
  this->length = 0xffffffff;
  goto LAB_0043be6f;
}

Assistant:

inline Time &operator += (const Time &other) {
		if(!other.length) return *this;
		if(!length) {
			*this = other;
			return *this;
		}

		uint64_t result_length;
		uint64_t result_clock_rate;
		if(clock_rate == other.clock_rate) {
			result_length = uint64_t(length) + uint64_t(other.length);
			result_clock_rate = uint64_t(clock_rate);
		} else {
			result_length = uint64_t(length) * uint64_t(other.clock_rate) + uint64_t(other.length) * uint64_t(clock_rate);
			result_clock_rate = uint64_t(clock_rate) * uint64_t(other.clock_rate);
		}
		install_result(result_length, result_clock_rate);
		return *this;
	}